

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::checkIfExtern(Assembler *this,string *line)

{
  bool bVar1;
  Assembler *this_00;
  string substr;
  smatch externM;
  string externString;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  int aiStack_198 [90];
  
  externM.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  externM._M_begin._M_current = (char *)0x0;
  externM.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  externM.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  externString._M_dataplus._M_p = (pointer)&externString.field_2;
  externString._M_string_length = 0;
  externString.field_2._M_local_buf[0] = '\0';
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&externM,&externDirectiveReg_abi_cxx11_,0);
  if ((bVar1) && (first == true)) {
    isGlobalFirst = false;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)&ss,&externM,1);
    std::__cxx11::string::operator=((string *)&externString,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&ss,(string *)&externString,_S_out|_S_in);
    while (*(int *)((long)aiStack_198 + *(long *)(_ss + -0x18)) == 0) {
      substr._M_dataplus._M_p = (pointer)&substr.field_2;
      substr._M_string_length = 0;
      substr.field_2._M_local_buf[0] = '\0';
      this_00 = (Assembler *)&substr;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&substr,',');
      removeSpaces(&local_1d8,this_00,&substr);
      std::__cxx11::string::operator=((string *)&substr,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::string((string *)&local_1f8,(string *)&substr);
      processExtern(this,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&substr);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::~string((string *)&externString);
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&externM);
  return bVar1;
}

Assistant:

bool Assembler::checkIfExtern(string line) {
    smatch externM;
    string externString;
    if (regex_match(line, externM, externDirectiveReg)) {
        if (first) {
            isGlobalFirst = false;
            externString = externM.str(1);
            stringstream ss(externString);
            while (ss.good()) {
                string substr;
                getline(ss, substr, ',');
                substr = removeSpaces(substr);
                processExtern(substr);
            }
        }
        return true;
    }
    return false;
}